

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fusion_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::LoopFusionPass::ProcessFunction(LoopFusionPass *this,Function *function)

{
  undefined1 l2 [8];
  undefined1 l1 [8];
  bool bVar1;
  bool bVar2;
  LoopDescriptor *this_00;
  pointer ppLVar3;
  byte bVar4;
  Loop *pLVar5;
  RegisterLiveness liveness;
  LoopFusion fusion;
  iterator __begin3;
  iterator __begin2;
  iterator __end3;
  iterator __end2;
  undefined1 local_290 [56];
  _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_258;
  ulong local_220;
  pointer ppStack_218;
  pointer local_210;
  pointer ppStack_208;
  RegisterLiveness local_200;
  LoopFusion local_1c0;
  undefined1 local_190 [8];
  _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
  local_188;
  undefined1 local_138 [8];
  _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
  local_130;
  Loop *local_e0;
  _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
  local_d8;
  Loop *local_88;
  _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
  local_80;
  
  this_00 = IRContext::GetLoopDescriptor((this->super_Pass).context_,function);
  bVar1 = LoopDescriptor::CreatePreHeaderBlocksIfMissing(this_00);
  pLVar5 = &this_00->placeholder_top_loop_;
  local_130._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_130._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_130._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_130._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_130._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_130._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_130._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_130._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_130._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_130._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_138 = (undefined1  [8])pLVar5;
  std::
  _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
  ::_M_initialize_map(&local_130,0);
  if ((local_138 != (undefined1  [8])0x0) &&
     (ppLVar3 = (((ChildrenList *)((long)local_138 + 0x38))->
                super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>).
                _M_impl.super__Vector_impl_data._M_start,
     ppLVar3 !=
     (((ChildrenList *)((long)local_138 + 0x38))->
     super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>)._M_impl.
     super__Vector_impl_data._M_finish)) {
    do {
      local_290._8_8_ = ppLVar3 + 1;
      local_290._0_8_ = local_138;
      std::
      deque<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>,std::allocator<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>>>
      ::
      emplace_back<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>>
                ((deque<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>,std::allocator<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>>>
                  *)&local_130,
                 (pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>
                  *)local_290);
      local_138 = (undefined1  [8])
                  *(((ChildrenList *)((long)local_138 + 0x38))->
                   super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
      ppLVar3 = (((Loop *)local_138)->nested_loops_).
                super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (ppLVar3 !=
             (((Loop *)local_138)->nested_loops_).
             super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  local_80._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_80._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_80._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_80._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_80._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_80._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_80._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_80._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_80._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_80._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  bVar4 = 0;
  local_88 = pLVar5;
  std::
  _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
  ::_M_initialize_map(&local_80,0);
  if (local_138 != (undefined1  [8])local_88) {
    do {
      l1 = local_138;
      local_188._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
      local_188._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
      local_188._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
      local_188._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
      local_188._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
      local_188._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
      local_188._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
      local_188._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
      local_188._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      local_188._M_impl.super__Deque_impl_data._M_map_size = 0;
      local_190 = (undefined1  [8])pLVar5;
      std::
      _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
      ::_M_initialize_map(&local_188,0);
      if (local_190 != (undefined1  [8])0x0) {
        while (ppLVar3 = (((ChildrenList *)((long)local_190 + 0x38))->
                         super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                         )._M_impl.super__Vector_impl_data._M_start,
              ppLVar3 !=
              (((ChildrenList *)((long)local_190 + 0x38))->
              super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>).
              _M_impl.super__Vector_impl_data._M_finish) {
          local_290._8_8_ = ppLVar3 + 1;
          local_290._0_8_ = local_190;
          std::
          deque<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>,std::allocator<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>>>
          ::
          emplace_back<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>>
                    ((deque<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>,std::allocator<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>>>
                      *)&local_188,
                     (pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>
                      *)local_290);
          local_190 = (undefined1  [8])
                      *(((ChildrenList *)((long)local_190 + 0x38))->
                       super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                       )._M_impl.super__Vector_impl_data._M_start;
        }
      }
      local_d8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
      local_d8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
      local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
      local_d8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
      local_d8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
      local_d8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
      local_d8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
      local_d8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
      local_d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      local_d8._M_impl.super__Deque_impl_data._M_map_size = 0;
      local_e0 = pLVar5;
      std::
      _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
      ::_M_initialize_map(&local_d8,0);
      while (l2 = local_190, local_190 != (undefined1  [8])local_e0) {
        local_1c0.context_ = (this->super_Pass).context_;
        local_1c0.loop_0_ = (Loop *)l1;
        local_1c0.loop_1_ = (Loop *)local_190;
        local_1c0.containing_function_ = (*(BasicBlock **)((long)l1 + 8))->function_;
        local_1c0.induction_0_ = (Instruction *)0x0;
        local_1c0.induction_1_ = (Instruction *)0x0;
        bVar2 = LoopFusion::AreCompatible(&local_1c0);
        if ((bVar2) && (bVar2 = LoopFusion::IsLegal(&local_1c0), bVar2)) {
          local_200.context_ = (this->super_Pass).context_;
          local_200.block_pressure_._M_h._M_buckets = (__buckets_ptr)((long)&local_200 + 0x38);
          local_200.block_pressure_._M_h._M_bucket_count = 1;
          local_200.block_pressure_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_200.block_pressure_._M_h._M_element_count = 0;
          local_200.block_pressure_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
          local_200.block_pressure_._M_h._M_rehash_policy._M_next_resize = 0;
          local_200.block_pressure_._M_h._M_single_bucket = (__node_base_ptr)0x0;
          RegisterLiveness::Analyze(&local_200,function);
          local_290._0_8_ = local_290 + 0x30;
          local_290._8_8_ = (pointer)0x1;
          local_290._16_8_ = (_Hash_node_base *)0x0;
          local_290._24_8_ = 0;
          local_290._32_8_ = 0x3f800000;
          local_290._40_8_ = 0;
          local_290._48_8_ = (__node_base_ptr)0x0;
          local_258._M_buckets = &local_258._M_single_bucket;
          local_258._M_bucket_count = 1;
          local_258._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_258._M_element_count = 0;
          local_258._M_rehash_policy._M_max_load_factor = 1.0;
          local_258._M_rehash_policy._4_4_ = 0;
          local_210 = (pointer)0x0;
          ppStack_208 = (pointer)0x0;
          local_220 = 0;
          ppStack_218 = (pointer)0x0;
          local_258._M_rehash_policy._M_next_resize = 0;
          local_258._M_single_bucket = (__node_base_ptr)0x0;
          RegisterLiveness::SimulateFusion
                    (&local_200,(Loop *)l1,(Loop *)l2,(RegionRegisterLiveness *)local_290);
          if (local_220 <= this->max_registers_per_loop_) {
            LoopFusion::Fuse(&local_1c0);
            ProcessFunction(this,function);
            if (ppStack_218 != (pointer)0x0) {
              operator_delete(ppStack_218,(long)ppStack_208 - (long)ppStack_218);
            }
            std::
            _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable(&local_258);
            std::
            _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable((_Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           *)local_290);
            std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)((long)&local_200 + 8));
            std::
            _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
            ::~_Deque_base(&local_d8);
            std::
            _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
            ::~_Deque_base(&local_188);
            bVar4 = 1;
            goto LAB_00247132;
          }
          if (ppStack_218 != (pointer)0x0) {
            operator_delete(ppStack_218,(long)ppStack_208 - (long)ppStack_218);
          }
          std::
          _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable(&local_258);
          std::
          _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)local_290);
          std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)((long)&local_200 + 8));
        }
        PostOrderTreeDFIterator<spvtools::opt::Loop>::operator++
                  ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)local_190);
      }
      std::
      _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
      ::~_Deque_base(&local_d8);
      std::
      _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
      ::~_Deque_base(&local_188);
      PostOrderTreeDFIterator<spvtools::opt::Loop>::operator++
                ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)local_138);
    } while (local_138 != (undefined1  [8])local_88);
    bVar4 = 0;
  }
LAB_00247132:
  std::
  _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
  ::~_Deque_base(&local_80);
  std::
  _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
  ::~_Deque_base(&local_130);
  return (bool)(bVar1 | bVar4);
}

Assistant:

bool LoopFusionPass::ProcessFunction(Function* function) {
  LoopDescriptor& ld = *context()->GetLoopDescriptor(function);

  // If a loop doesn't have a preheader needs then it needs to be created. Make
  // sure to return Status::SuccessWithChange in that case.
  auto modified = ld.CreatePreHeaderBlocksIfMissing();

  // TODO(tremmelg): Could the only loop that |loop| could possibly be fused be
  // picked out so don't have to check every loop
  for (auto& loop_0 : ld) {
    for (auto& loop_1 : ld) {
      LoopFusion fusion(context(), &loop_0, &loop_1);

      if (fusion.AreCompatible() && fusion.IsLegal()) {
        RegisterLiveness liveness(context(), function);
        RegisterLiveness::RegionRegisterLiveness reg_pressure{};
        liveness.SimulateFusion(loop_0, loop_1, &reg_pressure);

        if (reg_pressure.used_registers_ <= max_registers_per_loop_) {
          fusion.Fuse();
          // Recurse, as the current iterators will have been invalidated.
          ProcessFunction(function);
          return true;
        }
      }
    }
  }

  return modified;
}